

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bus.h
# Opt level: O2

uint8_t __thiscall Bus::cpuRead(Bus *this,uint16_t addr,bool bReadOnly)

{
  bool bVar1;
  uint8_t data;
  uint8_t local_19;
  
  local_19 = '\0';
  bVar1 = Catridge::cpuRead((this->cart).super___shared_ptr<Catridge,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr,addr,&local_19);
  if (!bVar1) {
    if (addr < 0x2000) {
      local_19 = (this->cpuRam)._M_elems[addr & 0x7ff];
    }
    else if (addr < 0x4000) {
      local_19 = m2C02::cpuRead(&this->ppu,addr & 7,bReadOnly);
    }
  }
  return local_19;
}

Assistant:

uint8_t cpuRead(uint16_t addr, bool bReadOnly = false) const
  {
    uint8_t data = 0x00u;
    if (cart->cpuRead(addr, data))
    {
    }
    else if (addr >= 0x0000u && addr <= 0x1FFFu)
    {
      data = cpuRam[addr & 0x07FFu];
    }
    else if (addr >= 0x2000u && addr <= 0x3FFFu)
    {
      data = ppu.cpuRead(addr & 0x0007u, bReadOnly);
    }
    return data;
  }